

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Stream::skip(Stream *this)

{
  bool bVar1;
  document_iterator i;
  document_iterator e;
  document_iterator local_20;
  document_iterator local_18;
  
  local_20 = begin(this);
  local_18.Doc = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0
  ;
  while( true ) {
    bVar1 = document_iterator::operator!=(&local_20,&local_18);
    if (!bVar1) break;
    Document::skip(((local_20.Doc)->_M_t).
                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
    document_iterator::operator++(&local_20);
  }
  return;
}

Assistant:

void Stream::skip() {
  for (document_iterator i = begin(), e = end(); i != e; ++i)
    i->skip();
}